

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abort.cpp
# Opt level: O0

void node::AbortNode(SignalInterrupt *shutdown,atomic<int> *exit_status,bilingual_str *message,
                    Warnings *warnings)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  LogFlags in_RCX;
  _Variant_storage_alias<kernel::Warning,_node::Warning> in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000010;
  memory_order __b;
  __memory_order_modifier in_stack_fffffffffffffe68;
  memory_order in_stack_fffffffffffffe6c;
  Warning *in_stack_fffffffffffffe70;
  bilingual_str *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar3;
  bilingual_str *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Warnings *in_stack_fffffffffffffe98;
  int source_line;
  ConstevalFormatString<0U> in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff20 [12];
  undefined4 in_stack_ffffffffffffff2c;
  string_view in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX != NONE) {
    in_stack_ffffffffffffff2c = 2;
    std::variant<kernel::Warning,node::Warning>::variant<node::Warning,void,void,node::Warning,void>
              ((variant<kernel::Warning,_node::Warning> *)in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
    bilingual_str::bilingual_str
              (in_stack_fffffffffffffe88,
               (bilingual_str *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    Warnings::Set(in_stack_fffffffffffffe98,(warning_type)in_RDX,
                  (bilingual_str *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  source_line = in_RDX._4_4_;
  ::_((ConstevalStringLiteral)0x1d009e0);
  ::operator+((bilingual_str *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              in_stack_fffffffffffffe78);
  InitError((bilingual_str *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::operator&(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  uVar3 = 5;
  LOCK();
  *(undefined4 *)&in_RSI->_M_len = 1;
  UNLOCK();
  if ((in_RDI != 0) &&
     (bVar2 = util::SignalInterrupt::operator()
                        ((SignalInterrupt *)CONCAT44(5,in_stack_fffffffffffffe80)), !bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RSI,(char *)CONCAT44(uVar3,in_stack_fffffffffffffe80));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RSI,(char *)CONCAT44(uVar3,in_stack_fffffffffffffe80));
    source_file._M_str._4_4_ = in_stack_ffffffffffffff2c;
    source_file._0_12_ = in_stack_ffffffffffffff20;
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffff30,source_file,source_line,in_RCX,in_stack_00000010,
               in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AbortNode(util::SignalInterrupt* shutdown, std::atomic<int>& exit_status, const bilingual_str& message, node::Warnings* warnings)
{
    if (warnings) warnings->Set(Warning::FATAL_INTERNAL_ERROR, message);
    InitError(_("A fatal internal error occurred, see debug.log for details: ") + message);
    exit_status.store(EXIT_FAILURE);
    if (shutdown && !(*shutdown)()) {
        LogError("Failed to send shutdown signal\n");
    };
}